

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

void __thiscall minibag::Recorder::startWriting(Recorder *this)

{
  CompressionType CVar1;
  String msg;
  BagException e;
  
  CVar1 = (CompressionType)&this->bag_;
  minibag::Bag::setCompression(CVar1);
  minibag::Bag::setChunkThreshold(CVar1);
  updateFilenames(this);
  minibag::Bag::open((string *)&this->bag_,(int)this + 0x3e0);
  if ((char)miniros::console::g_initialized == '\0') {
    miniros::console::initialize();
  }
  if (startWriting()::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"miniros.unknown_package",(allocator<char> *)&e);
    miniros::console::initializeLogLocation(&startWriting()::loc,(string *)&msg,Info);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (startWriting()::loc.level_ != Info) {
    miniros::console::setLogLocationLevel(&startWriting()::loc,Info);
    miniros::console::checkLogLocationEnabled(&startWriting()::loc);
  }
  if (startWriting()::loc.logger_enabled_ == true) {
    miniros::console::print
              ((FilterBase *)0x0,startWriting()::loc.logger_,startWriting()::loc.level_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
               ,0x166,"void minibag::Recorder::startWriting()","Recording to %s.",
               (this->target_filename_)._M_dataplus._M_p);
  }
  if ((this->options_).publish == true) {
    msg.data._M_dataplus._M_p = (pointer)&msg.data.field_2;
    msg.data._M_string_length = 0;
    msg.data.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&msg);
    miniros::Publisher::publish<std_msgs::String_<std::allocator<void>>>
              (&this->pub_begin_write,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void Recorder::startWriting()
{
  bag_.setCompression(options_.compression);
  bag_.setChunkThreshold(options_.chunk_size);

  updateFilenames();
  try {
    bag_.open(write_filename_, bagmode::Write);
  } catch (minibag::BagException e) {
    MINIROS_ERROR("Error writing: %s", e.what());
    exit_code_ = 1;
    miniros::shutdown();
  }
  MINIROS_INFO("Recording to %s.", target_filename_.c_str());

  if (options_.publish) {
    std_msgs::String msg;
    msg.data = target_filename_.c_str();
    pub_begin_write.publish(msg);
  }
}